

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnGetFloat(XL *out,char *key,float *value)

{
  XLearn *this;
  int iVar1;
  HyperParam *pHVar2;
  real_t *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  
  this = (XLearn *)*in_RDI;
  iVar1 = strcmp(in_RSI,"lr");
  if (iVar1 == 0) {
    pHVar2 = XLearn::GetHyperParam(this);
    *in_RDX = pHVar2->learning_rate;
  }
  else {
    iVar1 = strcmp(in_RSI,"lambda");
    if (iVar1 == 0) {
      pHVar2 = XLearn::GetHyperParam(this);
      *in_RDX = pHVar2->regu_lambda;
    }
    else {
      iVar1 = strcmp(in_RSI,"init");
      if (iVar1 == 0) {
        pHVar2 = XLearn::GetHyperParam(this);
        *in_RDX = pHVar2->model_scale;
      }
      else {
        iVar1 = strcmp(in_RSI,"alpha");
        if (iVar1 == 0) {
          pHVar2 = XLearn::GetHyperParam(this);
          *in_RDX = pHVar2->alpha;
        }
        else {
          iVar1 = strcmp(in_RSI,"beta");
          if (iVar1 == 0) {
            pHVar2 = XLearn::GetHyperParam(this);
            *in_RDX = pHVar2->beta;
          }
          else {
            iVar1 = strcmp(in_RSI,"lambda_1");
            if (iVar1 == 0) {
              pHVar2 = XLearn::GetHyperParam(this);
              *in_RDX = pHVar2->lambda_1;
            }
            else {
              iVar1 = strcmp(in_RSI,"lambda_2");
              if (iVar1 == 0) {
                pHVar2 = XLearn::GetHyperParam(this);
                *in_RDX = pHVar2->lambda_2;
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

XL_DLL int XLearnGetFloat(XL *out, const char *key, float *value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "lr") == 0) {
    *value = xl->GetHyperParam().learning_rate;
  } else if (strcmp(key, "lambda") == 0) {
    *value = xl->GetHyperParam().regu_lambda;
  } else if (strcmp(key, "init") == 0) {
    *value = xl->GetHyperParam().model_scale;
  } else if (strcmp(key, "alpha") == 0) {
    *value = xl->GetHyperParam().alpha;
  } else if (strcmp(key, "beta") == 0) {
    *value = xl->GetHyperParam().beta;
  } else if (strcmp(key, "lambda_1") == 0) {
    *value = xl->GetHyperParam().lambda_1;
  } else if (strcmp(key, "lambda_2") == 0) {
    *value = xl->GetHyperParam().lambda_2;
  }
  API_END();
}